

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall App::get_output_filename(App *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  DynamicFormat *pDVar2;
  char *pcVar3;
  string_view name;
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_272;
  undefined1 local_271;
  allocator<char> local_270;
  allocator<char> local_26f;
  allocator<char> local_26e;
  allocator<char> local_26d;
  allocator<char> local_26c;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  undefined1 local_160 [47];
  allocator<char> local_131;
  string local_130;
  save_file local_110;
  undefined1 local_100 [8];
  string results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_type local_a0;
  size_type dot;
  allocator<char> local_81;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined1 local_70 [8];
  string extension;
  string guessed_output_name;
  DynamicFormat *guessed_output_format;
  App *this_local;
  
  auVar4 = (**(code **)(*(long *)this->input_format + 8))();
  name._M_str = auVar4._8_8_;
  name._M_len = (size_t)name._M_str;
  pDVar2 = ritobin::io::DynamicFormat::get(auVar4._0_8_,name);
  std::__cxx11::string::string((string *)(extension.field_2._M_local_buf + 8));
  if (pDVar2 != (DynamicFormat *)0x0) {
    local_80 = (basic_string_view<char,_std::char_traits<char>_>)
               (**(code **)(*(long *)pDVar2 + 0x10))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_70,&local_80,&local_81);
    std::allocator<char>::~allocator(&local_81);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
    if (!bVar1) {
      local_a0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_last_of(&this->input_filename,".",0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&results.field_2 + 8),&this->input_filename,0,local_a0);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&results.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&extension.field_2 + 8),&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)(results.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&extension.field_2 + 8));
  printf("Guessed name: %s\n",pcVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"ritobin output file",&local_131);
  local_271 = 1;
  local_268 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"All Files",&local_269);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"*",&local_26a);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"bin files",&local_26b);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"*.bin",&local_26c);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"text files",&local_26d);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"*.txt *.py",&local_26e);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"json files",&local_26f);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"*.json",&local_270);
  local_271 = 0;
  local_160._0_8_ = &local_260;
  local_160._8_8_ = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_272);
  __l._M_len = local_160._8_8_;
  __l._M_array = (iterator)local_160._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_160 + 0x10),__l,&local_272);
  pfd::save_file::save_file
            (&local_110,&local_130,(string *)((long)&extension.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_160 + 0x10),force_overwrite);
  pfd::save_file::result_abi_cxx11_((string *)local_100,&local_110);
  pfd::save_file::~save_file(&local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_160 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_272);
  local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  do {
    local_328 = local_328 + -1;
    std::__cxx11::string::~string((string *)local_328);
  } while (local_328 != &local_260);
  std::allocator<char>::~allocator(&local_270);
  std::allocator<char>::~allocator(&local_26f);
  std::allocator<char>::~allocator(&local_26e);
  std::allocator<char>::~allocator(&local_26d);
  std::allocator<char>::~allocator(&local_26c);
  std::allocator<char>::~allocator(&local_26b);
  std::allocator<char>::~allocator(&local_26a);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
  ;
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_filename,"");
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  this_local._7_1_ = !bVar1;
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool get_output_filename() {
        DynamicFormat const* guessed_output_format = DynamicFormat::get(input_format->oposite_name());
        std::string guessed_output_name = {};
        if (guessed_output_format) {
            std::string extension = std::string(guessed_output_format->default_extension());
            if (!extension.empty()) {
                auto const dot = input_filename.find_last_of(".");
                guessed_output_name = input_filename.substr(0, dot) + extension;
            }
        }
        printf("Guessed name: %s\n", guessed_output_name.c_str());
        auto results = pfd::save_file("ritobin output file", guessed_output_name,
                                      {
                                          "All Files", "*",
                                          "bin files", "*.bin",
                                          "text files", "*.txt *.py",
                                          "json files", "*.json",
                                      }, pfd::opt::force_overwrite).result();
        if (results.empty()) {
            output_filename = "";
            return false;
        }
        output_filename = std::move(results);
        return true;
    }